

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void searchlight_movement(searchlight_movement_t *slstate)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  uint8_t uVar4;
  direction_t direction;
  uint8_t *ptr;
  uint8_t index;
  uint8_t y;
  uint8_t x;
  searchlight_movement_t *slstate_local;
  
  uVar1 = (slstate->xy).x;
  uVar2 = (slstate->xy).y;
  uVar4 = slstate->counter + 0xff;
  slstate->counter = uVar4;
  if (uVar4 == '\0') {
    bVar3 = slstate->index;
    if ((bVar3 & 0x80) == 0) {
      index = bVar3 + 1;
      slstate->index = index;
    }
    else if ((bVar3 & 0x7f) == 0) {
      slstate->index = slstate->index & 0x7f;
      index = '\0';
    }
    else {
      slstate->index = slstate->index + 0xff;
      index = (bVar3 & 0x7f) - 1;
    }
    ptr = slstate->ptr + (int)((uint)index << 1);
    if (*ptr == 0xff) {
      slstate->index = slstate->index + 0xff;
      slstate->index = slstate->index | 0x80;
      ptr = ptr + -2;
    }
    slstate->counter = *ptr;
    slstate->direction = ptr[1];
  }
  else {
    direction = slstate->direction;
    if ((slstate->index & 0x80) != 0) {
      direction = direction ^ 2;
    }
    if (direction < 2) {
      y = uVar2 + 0xff;
    }
    else {
      y = uVar2 + '\x01';
    }
    if ((direction == '\0') || (direction == '\x03')) {
      x = uVar1 + 0xfe;
    }
    else {
      x = uVar1 + '\x02';
    }
    (slstate->xy).x = x;
    (slstate->xy).y = y;
  }
  return;
}

Assistant:

void searchlight_movement(searchlight_movement_t *slstate)
{
#define REVERSE (1 << 7)

  uint8_t        x,y;       /* was E,D */
  uint8_t        index;     /* was A */
  const uint8_t *ptr;       /* was BC */
  direction_t    direction; /* was A */

  assert(slstate != NULL);

  x = slstate->xy.x;
  y = slstate->xy.y;
  if (--slstate->counter == 0)
  {
    /* End of previous sweep: work out the next. */

    index = slstate->index; // sampled HL = $AD3B, $AD34, $AD2D
    if (index & REVERSE) /* reverse direction bit set */
    {
      index &= ~REVERSE;
      if (index == 0)
      {
        slstate->index &= ~REVERSE; /* clear direction bit when index hits zero */
      }
      else
      {
        slstate->index--; /* count down */
        index--; /* just a copy sans direction bit */
        assert(index == (slstate->index ^ REVERSE));
      }
    }
    else
    {
      slstate->index = ++index; /* count up */
    }
    assert(index <= 8); // movement_1 is the longest
    ptr = slstate->ptr + index * 2;
    if (*ptr == 255) /* end of list? */
    {
      slstate->index--; /* overshot? count down counter byte */
      slstate->index |= REVERSE; /* go negative */
      ptr -= 2;
      // A = *ptr; /* BUG: This is a flaw in original code: A is fetched but never used again. */
    }
    /* Copy counter + direction_t. */
    slstate->counter   = ptr[0];
    slstate->direction = ptr[1];
  }
  else
  {
    direction = slstate->direction;
    if (slstate->index & REVERSE) /* test sign */
      direction ^= 2; /* toggle direction */

    /* Conv: This is the [-2]+1 pattern which works out -1/+1. */
    if (direction <= direction_TOP_RIGHT) /* direction_TOP_* */
      y--;
    else
      y++;

    if (direction != direction_TOP_LEFT &&
        direction != direction_BOTTOM_LEFT)
      x += 2; /* direction_*_RIGHT */
    else
      x -= 2; /* direction_*_LEFT */

    slstate->xy.x = x; // Conv: Reversed store order.
    slstate->xy.y = y;
  }

#undef REVERSE
}